

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O0

void __thiscall cmConfigureLog::WriteBacktrace(cmConfigureLog *this,cmMakefile *mf)

{
  bool bVar1;
  cmake *this_00;
  string *psVar2;
  cmListFileContext *pcVar3;
  ulong uVar4;
  string_view key;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  ostringstream s;
  string local_100;
  undefined1 local_e0 [8];
  cmListFileContext t;
  cmListFileBacktrace bt;
  undefined1 local_50 [8];
  string root;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  backtrace;
  cmMakefile *mf_local;
  cmConfigureLog *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&root.field_2 + 8));
  this_00 = cmMakefile::GetCMakeInstance(mf);
  psVar2 = cmake::GetHomeDirectory_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)local_50,(string *)psVar2);
  cmMakefile::GetBacktrace
            ((cmMakefile *)
             &t.DeferId.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged);
  while (bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                           ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)
                            &t.DeferId.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_engaged), ((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar3 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)
                        &t.DeferId.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_engaged);
    cmListFileContext::cmListFileContext((cmListFileContext *)local_e0,pcVar3);
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) || (t.FilePath.field_2._8_8_ == -1)) {
      cmSystemTools::RelativeIfUnder
                (&local_100,(string *)local_50,(string *)((long)&t.Name.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(t.Name.field_2._M_local_buf + 8),(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
      ::operator<<((ostream *)local_278,(cmListFileContext *)local_e0);
      std::__cxx11::ostringstream::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (root.field_2._M_local_buf + 8),&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
    }
    cmListFileContext::~cmListFileContext((cmListFileContext *)local_e0);
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop(&local_2a8);
    cmListFileBacktrace::operator=
              ((cmListFileBacktrace *)
               &t.DeferId.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged,(cmListFileBacktrace *)&local_2a8);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_2a8);
  }
  cmListFileBacktrace::~cmListFileBacktrace
            ((cmListFileBacktrace *)
             &t.DeferId.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged);
  key = (string_view)::cm::operator____s("backtrace",9);
  WriteValue(this,key,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&root.field_2 + 8));
  std::__cxx11::string::~string((string *)local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&root.field_2 + 8));
  return;
}

Assistant:

void cmConfigureLog::WriteBacktrace(cmMakefile const& mf)
{
  std::vector<std::string> backtrace;
  auto root = mf.GetCMakeInstance()->GetHomeDirectory();
  for (auto bt = mf.GetBacktrace(); !bt.Empty(); bt = bt.Pop()) {
    auto t = bt.Top();
    if (!t.Name.empty() || t.Line == cmListFileContext::DeferPlaceholderLine) {
      t.FilePath = cmSystemTools::RelativeIfUnder(root, t.FilePath);
      std::ostringstream s;
      s << t;
      backtrace.emplace_back(s.str());
    }
  }
  this->WriteValue("backtrace"_s, backtrace);
}